

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void __thiscall ALCcontext::setError(ALCcontext *this,ALenum errorCode,char *msg,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  char *__cur;
  undefined8 in_RCX;
  undefined8 in_R8;
  char *pcVar3;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector<char> message;
  va_list args2;
  va_list args;
  vector<char,_al::allocator<char,_1UL>_> local_148;
  undefined8 local_128;
  pointer *local_120;
  undefined1 *local_118;
  undefined8 local_108;
  pointer *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_start = al::allocator<char,_1UL>::allocate((allocator<char,_1UL> *)&local_148,0x100);
  pcVar3 = local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
           super__Vector_impl_data._M_start + 0x100;
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar3;
  memset(local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x100);
  local_108 = 0x3000000018;
  local_120 = &message.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_128 = 0x3000000018;
  local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar3;
  local_118 = local_e8;
  local_100 = local_120;
  local_f8 = local_e8;
  uVar1 = vsnprintf(local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pcVar3 -
                    (long)local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                          super__Vector_impl_data._M_start,msg,&local_108);
  if (-1 < (int)uVar1) {
    pcVar3 = local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)uVar1 <
        (ulong)((long)local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                     super__Vector_impl_data._M_start)) goto LAB_0011eae7;
    std::vector<char,_al::allocator<char,_1UL>_>::resize(&local_148,(ulong)uVar1 + 1);
    iVar2 = vsnprintf(local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
                            super__Vector_impl_data._M_start,msg,&local_128);
    pcVar3 = local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (-1 < iVar2) goto LAB_0011eae7;
  }
  pcVar3 = "<internal error constructing message>";
LAB_0011eae7:
  if (1 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Error generated on context %p, code 0x%04x, \"%s\"\n",
            this,errorCode,pcVar3);
  }
  if (TrapALError == true) {
    raise(5);
  }
  LOCK();
  if ((this->mLastError).super___atomic_base<int>._M_i == 0) {
    (this->mLastError).super___atomic_base<int>._M_i = errorCode;
  }
  UNLOCK();
  if (local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    al_free(local_148.super__Vector_base<char,_al::allocator<char,_1UL>_>._M_impl.
            super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ALCcontext::setError(ALenum errorCode, const char *msg, ...)
{
    auto message = al::vector<char>(256);

    va_list args, args2;
    va_start(args, msg);
    va_copy(args2, args);
    int msglen{std::vsnprintf(message.data(), message.size(), msg, args)};
    if(msglen >= 0 && static_cast<size_t>(msglen) >= message.size())
    {
        message.resize(static_cast<size_t>(msglen) + 1u);
        msglen = std::vsnprintf(message.data(), message.size(), msg, args2);
    }
    va_end(args2);
    va_end(args);

    if(msglen >= 0) msg = message.data();
    else msg = "<internal error constructing message>";

    WARN("Error generated on context %p, code 0x%04x, \"%s\"\n",
        decltype(std::declval<void*>()){this}, errorCode, msg);
    if(TrapALError)
    {
#ifdef _WIN32
        /* DebugBreak will cause an exception if there is no debugger */
        if(IsDebuggerPresent())
            DebugBreak();
#elif defined(SIGTRAP)
        raise(SIGTRAP);
#endif
    }

    ALenum curerr{AL_NO_ERROR};
    mLastError.compare_exchange_strong(curerr, errorCode);
}